

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O3

void __thiscall SocketPP::TCPServer::onDisconnected(TCPServer *this,int fd)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  long lVar5;
  ulong uVar6;
  pointer __dest;
  TCPStream local_1c;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->streamMutex_);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  pTVar2 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_start;
  pTVar4 = (this->connectedStreams_).
           super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
           super__Vector_impl_data._M_finish;
  uVar6 = (long)pTVar4 - (long)pTVar2;
  pTVar3 = pTVar2;
  if (0 < (long)uVar6 >> 4) {
    pTVar3 = (pointer)((long)&pTVar2->fd + (uVar6 & 0xfffffffffffffff0));
    lVar5 = ((long)uVar6 >> 4) + 1;
    __dest = pTVar2 + 2;
    do {
      if (__dest[-2].fd == fd) {
        __dest = __dest + -2;
        goto LAB_0010504a;
      }
      if (__dest[-1].fd == fd) {
        __dest = __dest + -1;
        goto LAB_0010504a;
      }
      if (__dest->fd == fd) goto LAB_0010504a;
      if (__dest[1].fd == fd) {
        __dest = __dest + 1;
        goto LAB_0010504a;
      }
      lVar5 = lVar5 + -1;
      __dest = __dest + 4;
    } while (1 < lVar5);
    uVar6 = (long)pTVar4 - (long)pTVar3;
  }
  lVar5 = (long)uVar6 >> 2;
  if (lVar5 == 1) {
LAB_0010502f:
    __dest = pTVar3;
    if (pTVar3->fd != fd) {
      __dest = pTVar4;
    }
LAB_0010504a:
    if (__dest != pTVar4) {
      pTVar3 = __dest + 1;
      if (pTVar3 != pTVar4) {
        memmove(__dest,pTVar3,(long)pTVar4 - (long)pTVar3);
        pTVar2 = (this->connectedStreams_).
                 super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar4 = (this->connectedStreams_).
                 super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      (this->connectedStreams_).
      super__Vector_base<SocketPP::TCPStream,_std::allocator<SocketPP::TCPStream>_>._M_impl.
      super__Vector_impl_data._M_finish = pTVar4 + -1;
      printf("\x1b[33m%s: connectedStreams_.size()=%ld\x1b[m\n","TCPServer.cpp",
             (long)(pTVar4 + -1) - (long)pTVar2 >> 2);
      if ((this->discHandle_).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_1c.fd = fd;
        (*(this->discHandle_)._M_invoker)((_Any_data *)&this->discHandle_,&local_1c);
      }
      goto LAB_001050d1;
    }
  }
  else {
    if (lVar5 == 2) {
LAB_00105027:
      __dest = pTVar3;
      if (pTVar3->fd != fd) {
        pTVar3 = pTVar3 + 1;
        goto LAB_0010502f;
      }
      goto LAB_0010504a;
    }
    if (lVar5 == 3) {
      __dest = pTVar3;
      if (pTVar3->fd != fd) {
        pTVar3 = pTVar3 + 1;
        goto LAB_00105027;
      }
      goto LAB_0010504a;
    }
  }
  printf("\x1b[31mERROR: %s: %s: %d: fd:%d is not in connectedStreams_!\x1b[m\n","TCPServer.cpp",
         "onDisconnected",0xa6,fd);
LAB_001050d1:
  pthread_mutex_unlock((pthread_mutex_t *)&this->streamMutex_);
  return;
}

Assistant:

void TCPServer::onDisconnected(int fd) {
    std::lock_guard<std::mutex> lockStream(streamMutex_);
    auto iter = std::find_if(connectedStreams_.cbegin(), connectedStreams_.cend(),
                             [&](TCPStream stream) { return stream.fd == fd; });

    if (iter == connectedStreams_.cend()) {
        LOGE("fd:%d is not in connectedStreams_!", fd);
        return;
    }

    connectedStreams_.erase(iter);

    LOGD("connectedStreams_.size()=%ld", connectedStreams_.size());

    if (discHandle_)
        discHandle_(fd);
}